

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat_end_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<true>>::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (repeat_end_matcher<mpl_::bool_<true>> *this,long state,long *next)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  uint *puVar5;
  
  uVar1 = *(uint *)(*(long *)(state + 8) + 0x14 + (long)*(int *)this * 0x28);
  if (uVar1 < *(uint *)(this + 8)) {
    puVar5 = (uint *)(*(long *)(state + 8) + (long)*(int *)this * 0x28 + 0x14);
    *puVar5 = uVar1 + 1;
    cVar2 = (**(code **)(**(long **)(this + 0x10) + 0x10))(*(long **)(this + 0x10),state);
    bVar3 = true;
    if (cVar2 == '\0') {
      uVar1 = *puVar5;
      *puVar5 = uVar1 - 1;
      if (*(uint *)(this + 4) <= uVar1 - 1) goto LAB_0012f3ac;
      bVar3 = false;
    }
    return bVar3;
  }
LAB_0012f3ac:
  uVar4 = (**(code **)(*next + 0x10))(next,state);
  return (bool)uVar4;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::true_) const
        {
            sub_match_impl<BidiIter> &br = state.sub_match(this->mark_number_);

            if(this->max_ > br.repeat_count_)
            {
                ++br.repeat_count_;
                // loop back to the expression "pushed" in repeat_begin_matcher::match
                if(next.top_match(state, this->back_))
                {
                    return true;
                }
                else if(--br.repeat_count_ < this->min_)
                {
                    return false;
                }
            }

            // looping finished, continue matching the rest of the pattern
            return next.skip_match(state);
        }